

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * sys_alloc(mstate m,size_t nb)

{
  char *oldbase_00;
  int iVar1;
  msegmentptr __len;
  void *pvVar2;
  ulong uVar3;
  void *pvVar4;
  mchunkptr pmVar5;
  mchunkptr pmVar6;
  int *piVar7;
  bool bVar8;
  void *local_f0;
  msegmentptr local_e8;
  mchunkptr r;
  mchunkptr p;
  size_t rsize;
  char *oldbase;
  msegmentptr sp;
  mchunkptr mn;
  size_t ssize_1;
  char *end_1;
  char *br_1;
  char *mp;
  char *end;
  size_t esize;
  size_t fp_1;
  char *base;
  msegmentptr ss;
  size_t ssize;
  char *br;
  size_t fp;
  void *mem;
  size_t asize;
  msegmentptr pmStack_30;
  flag_t mmap_flag;
  size_t tsize;
  char *tbase;
  size_t nb_local;
  mstate m_local;
  
  tsize = 0xffffffffffffffff;
  pmStack_30 = (msegmentptr)0x0;
  asize._4_4_ = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((((m->mflags & 1) == 0) || (nb < mparams.mmap_threshold)) || (m->topsize == 0)) ||
     (m_local = (mstate)mmap_alloc(m,nb), m_local == (mstate)0x0)) {
    __len = (msegmentptr)
            (nb + mparams.granularity + 0x5f & (mparams.granularity - 1 ^ 0xffffffffffffffff));
    if (nb < __len) {
      if ((m->footprint_limit == 0) ||
         ((uVar3 = (long)&__len->base + m->footprint, m->footprint < uVar3 &&
          (uVar3 <= m->footprint_limit)))) {
        if ((m->mflags & 4) == 0) {
          ssize = 0xffffffffffffffff;
          if (m->top == (mchunkptr)0x0) {
            local_e8 = (msegmentptr)0x0;
          }
          else {
            local_e8 = segment_holding(m,(char *)m->top);
          }
          iVar1 = malloc_global_mutex;
          LOCK();
          malloc_global_mutex = 1;
          UNLOCK();
          if (iVar1 != 0) {
            spin_acquire_lock(&malloc_global_mutex);
          }
          if (local_e8 == (msegmentptr)0x0) {
            pvVar2 = sbrk(0);
            ss = __len;
            if (pvVar2 != (void *)0xffffffffffffffff) {
              if (((ulong)pvVar2 & mparams.page_size - 1) != 0) {
                ss = (msegmentptr)
                     ((((long)pvVar2 + (mparams.page_size - 1) &
                       (mparams.page_size - 1 ^ 0xffffffffffffffff)) - (long)pvVar2) + (long)__len);
              }
              uVar3 = (long)&ss->base + m->footprint;
              if ((((nb < ss) && (ss < (msegmentptr)0x7fffffffffffffff)) &&
                  ((m->footprint_limit == 0 ||
                   ((m->footprint < uVar3 && (uVar3 <= m->footprint_limit)))))) &&
                 (ssize = (size_t)sbrk((intptr_t)ss), (void *)ssize == pvVar2)) {
                pmStack_30 = ss;
                tsize = (size_t)pvVar2;
              }
            }
          }
          else {
            ss = (msegmentptr)
                 ((nb - m->topsize) + mparams.granularity + 0x5f &
                 (mparams.granularity - 1 ^ 0xffffffffffffffff));
            if ((ss < (msegmentptr)0x7fffffffffffffff) &&
               (ssize = (size_t)sbrk((intptr_t)ss), (char *)ssize == local_e8->base + local_e8->size
               )) {
              pmStack_30 = ss;
              tsize = (size_t)(char *)ssize;
            }
          }
          if (tsize == 0xffffffffffffffff) {
            if ((((ssize != 0xffffffffffffffff) && (ss < (msegmentptr)0x7fffffffffffffff)) &&
                (ss < (msegmentptr)(nb + 0x60))) &&
               (uVar3 = (nb - (long)ss) + mparams.granularity + 0x5f &
                        (mparams.granularity - 1 ^ 0xffffffffffffffff), uVar3 < 0x7fffffffffffffff))
            {
              pvVar2 = sbrk(uVar3);
              if (pvVar2 == (void *)0xffffffffffffffff) {
                sbrk(-(long)ss);
                ssize = 0xffffffffffffffff;
              }
              else {
                ss = (msegmentptr)((long)&ss->base + uVar3);
              }
            }
            if (ssize == 0xffffffffffffffff) {
              m->mflags = m->mflags | 4;
            }
            else {
              tsize = ssize;
              pmStack_30 = ss;
            }
          }
          malloc_global_mutex = 0;
        }
        if (tsize == 0xffffffffffffffff) {
          if (dev_zero_fd < 0) {
            dev_zero_fd = open("/dev/zero",2);
            local_f0 = mmap((void *)0x0,(size_t)__len,3,2,dev_zero_fd,0);
          }
          else {
            local_f0 = mmap((void *)0x0,(size_t)__len,3,2,dev_zero_fd,0);
          }
          if (local_f0 != (void *)0xffffffffffffffff) {
            tsize = (size_t)local_f0;
            pmStack_30 = __len;
          }
          asize._4_4_ = (flag_t)(local_f0 != (void *)0xffffffffffffffff);
        }
        iVar1 = malloc_global_mutex;
        if ((tsize == 0xffffffffffffffff) && (__len < (msegmentptr)0x7fffffffffffffff)) {
          LOCK();
          malloc_global_mutex = 1;
          UNLOCK();
          if (iVar1 != 0) {
            spin_acquire_lock(&malloc_global_mutex);
          }
          pvVar2 = sbrk((intptr_t)__len);
          pvVar4 = sbrk(0);
          malloc_global_mutex = 0;
          if (((pvVar2 != (void *)0xffffffffffffffff) && (pvVar4 != (void *)0xffffffffffffffff)) &&
             ((pvVar2 < pvVar4 &&
              ((msegmentptr)(nb + 0x50) < (msegmentptr)((long)pvVar4 - (long)pvVar2))))) {
            pmStack_30 = (msegmentptr)((long)pvVar4 - (long)pvVar2);
            tsize = (size_t)pvVar2;
          }
        }
        if (tsize != 0xffffffffffffffff) {
          uVar3 = (long)&pmStack_30->base + m->footprint;
          m->footprint = uVar3;
          if (m->max_footprint < uVar3) {
            m->max_footprint = m->footprint;
          }
          if (m->top == (mchunkptr)0x0) {
            if ((m->least_addr == (char *)0x0) || (tsize < m->least_addr)) {
              m->least_addr = (char *)tsize;
            }
            (m->seg).base = (char *)tsize;
            (m->seg).size = (size_t)pmStack_30;
            (m->seg).sflags = asize._4_4_;
            m->magic = mparams.magic;
            m->release_checks = 0xfff;
            init_bins(m);
            if (m == &_gm_) {
              init_top(&_gm_,(mchunkptr)tsize,(size_t)&pmStack_30[-3].next);
            }
            else {
              pmVar5 = (mchunkptr)((long)m->smallbins + ((m[-1].exts & 0xfffffffffffffff8) - 0x58));
              init_top(m,pmVar5,(long)pmStack_30 + (tsize - (long)pmVar5) + -0x50);
            }
          }
          else {
            oldbase = (char *)&m->seg;
            while( true ) {
              bVar8 = false;
              if (oldbase != (char *)0x0) {
                bVar8 = tsize != *(long *)oldbase + *(long *)(oldbase + 8);
              }
              if (!bVar8) break;
              oldbase = *(char **)(oldbase + 0x10);
            }
            if ((((oldbase == (char *)0x0) || ((*(uint *)(oldbase + 0x18) & 8) != 0)) ||
                ((*(uint *)(oldbase + 0x18) & 1) != asize._4_4_)) ||
               ((m->top < *(mchunkptr *)oldbase ||
                ((mchunkptr)(*(long *)oldbase + *(long *)(oldbase + 8)) <= m->top)))) {
              if (tsize < m->least_addr) {
                m->least_addr = (char *)tsize;
              }
              oldbase = (char *)&m->seg;
              while( true ) {
                bVar8 = false;
                if (oldbase != (char *)0x0) {
                  bVar8 = *(long *)oldbase != (long)&pmStack_30->base + tsize;
                }
                if (!bVar8) break;
                oldbase = *(char **)(oldbase + 0x10);
              }
              if (((oldbase != (char *)0x0) && ((*(uint *)(oldbase + 0x18) & 8) == 0)) &&
                 ((*(uint *)(oldbase + 0x18) & 1) == asize._4_4_)) {
                oldbase_00 = *(char **)oldbase;
                *(size_t *)oldbase = tsize;
                *(long *)(oldbase + 8) = (long)&pmStack_30->base + *(long *)(oldbase + 8);
                pvVar2 = prepend_alloc(m,(char *)tsize,oldbase_00,nb);
                return pvVar2;
              }
              add_segment(m,(char *)tsize,(size_t)pmStack_30,asize._4_4_);
            }
            else {
              *(long *)(oldbase + 8) = (long)&pmStack_30->base + *(long *)(oldbase + 8);
              init_top(m,m->top,(long)&pmStack_30->base + m->topsize);
            }
          }
          if (nb < m->topsize) {
            uVar3 = m->topsize - nb;
            m->topsize = uVar3;
            pmVar5 = m->top;
            pmVar6 = (mchunkptr)((long)&pmVar5->prev_foot + nb);
            m->top = pmVar6;
            pmVar6->head = uVar3 | 1;
            pmVar5->head = nb | 3;
            return &pmVar5->fd;
          }
        }
        piVar7 = _PDCLIB_errno_func();
        *piVar7 = 0xc;
        m_local = (mstate)0x0;
      }
      else {
        m_local = (mstate)0x0;
      }
    }
    else {
      m_local = (mstate)0x0;
    }
  }
  return m_local;
}

Assistant:

static void* sys_alloc(mstate m, size_t nb) {
  char* tbase = CMFAIL;
  size_t tsize = 0;
  flag_t mmap_flag = 0;
  size_t asize; /* allocation size */

  ensure_initialization();

  /* Directly map large chunks, but only if already initialized */
  if (use_mmap(m) && nb >= mparams.mmap_threshold && m->topsize != 0) {
    void* mem = mmap_alloc(m, nb);
    if (mem != 0)
      return mem;
  }

  asize = granularity_align(nb + SYS_ALLOC_PADDING);
  if (asize <= nb)
    return 0; /* wraparound */
  if (m->footprint_limit != 0) {
    size_t fp = m->footprint + asize;
    if (fp <= m->footprint || fp > m->footprint_limit)
      return 0;
  }

  /*
    Try getting memory in any of three ways (in most-preferred to
    least-preferred order):
    1. A call to MORECORE that can normally contiguously extend memory.
       (disabled if not MORECORE_CONTIGUOUS or not HAVE_MORECORE or
       or main space is mmapped or a previous contiguous call failed)
    2. A call to MMAP new space (disabled if not HAVE_MMAP).
       Note that under the default settings, if MORECORE is unable to
       fulfill a request, and HAVE_MMAP is true, then mmap is
       used as a noncontiguous system allocator. This is a useful backup
       strategy for systems with holes in address spaces -- in this case
       sbrk cannot contiguously expand the heap, but mmap may be able to
       find space.
    3. A call to MORECORE that cannot usually contiguously extend memory.
       (disabled if not HAVE_MORECORE)

   In all cases, we need to request enough bytes from system to ensure
   we can malloc nb bytes upon success, so pad with enough space for
   top_foot, plus alignment-pad to make sure we don't lose bytes if
   not on boundary, and round this up to a granularity unit.
  */

  if (MORECORE_CONTIGUOUS && !use_noncontiguous(m)) {
    char* br = CMFAIL;
    size_t ssize = asize; /* sbrk call size */
    msegmentptr ss = (m->top == 0)? 0 : segment_holding(m, (char*)m->top);
    ACQUIRE_MALLOC_GLOBAL_LOCK();

    if (ss == 0) {  /* First time through or recovery */
      char* base = (char*)CALL_MORECORE(0);
      if (base != CMFAIL) {
        size_t fp;
        /* Adjust to end on a page boundary */
        if (!is_page_aligned(base))
          ssize += (page_align((size_t)base) - (size_t)base);
        fp = m->footprint + ssize; /* recheck limits */
        if (ssize > nb && ssize < HALF_MAX_SIZE_T &&
            (m->footprint_limit == 0 ||
             (fp > m->footprint && fp <= m->footprint_limit)) &&
            (br = (char*)(CALL_MORECORE(ssize))) == base) {
          tbase = base;
          tsize = ssize;
        }
      }
    }
    else {
      /* Subtract out existing available top space from MORECORE request. */
      ssize = granularity_align(nb - m->topsize + SYS_ALLOC_PADDING);
      /* Use mem here only if it did continuously extend old space */
      if (ssize < HALF_MAX_SIZE_T &&
          (br = (char*)(CALL_MORECORE(ssize))) == ss->base+ss->size) {
        tbase = br;
        tsize = ssize;
      }
    }

    if (tbase == CMFAIL) {    /* Cope with partial failure */
      if (br != CMFAIL) {    /* Try to use/extend the space we did get */
        if (ssize < HALF_MAX_SIZE_T &&
            ssize < nb + SYS_ALLOC_PADDING) {
          size_t esize = granularity_align(nb + SYS_ALLOC_PADDING - ssize);
          if (esize < HALF_MAX_SIZE_T) {
            char* end = (char*)CALL_MORECORE(esize);
            if (end != CMFAIL)
              ssize += esize;
            else {            /* Can't use; try to release */
              (void) CALL_MORECORE(-ssize);
              br = CMFAIL;
            }
          }
        }
      }
      if (br != CMFAIL) {    /* Use the space we did get */
        tbase = br;
        tsize = ssize;
      }
      else
        disable_contiguous(m); /* Don't try contiguous path in the future */
    }

    RELEASE_MALLOC_GLOBAL_LOCK();
  }

  if (HAVE_MMAP && tbase == CMFAIL) {  /* Try MMAP */
    char* mp = (char*)(CALL_MMAP(asize));
    if (mp != CMFAIL) {
      tbase = mp;
      tsize = asize;
      mmap_flag = USE_MMAP_BIT;
    }
  }

  if (HAVE_MORECORE && tbase == CMFAIL) { /* Try noncontiguous MORECORE */
    if (asize < HALF_MAX_SIZE_T) {
      char* br = CMFAIL;
      char* end = CMFAIL;
      ACQUIRE_MALLOC_GLOBAL_LOCK();
      br = (char*)(CALL_MORECORE(asize));
      end = (char*)(CALL_MORECORE(0));
      RELEASE_MALLOC_GLOBAL_LOCK();
      if (br != CMFAIL && end != CMFAIL && br < end) {
        size_t ssize = end - br;
        if (ssize > nb + TOP_FOOT_SIZE) {
          tbase = br;
          tsize = ssize;
        }
      }
    }
  }

  if (tbase != CMFAIL) {

    if ((m->footprint += tsize) > m->max_footprint)
      m->max_footprint = m->footprint;

    if (!is_initialized(m)) { /* first-time initialization */
      if (m->least_addr == 0 || tbase < m->least_addr)
        m->least_addr = tbase;
      m->seg.base = tbase;
      m->seg.size = tsize;
      m->seg.sflags = mmap_flag;
      m->magic = mparams.magic;
      m->release_checks = MAX_RELEASE_CHECK_RATE;
      init_bins(m);
#if !ONLY_MSPACES
      if (is_global(m))
        init_top(m, (mchunkptr)tbase, tsize - TOP_FOOT_SIZE);
      else
#endif
      {
        /* Offset top by embedded malloc_state */
        mchunkptr mn = next_chunk(mem2chunk(m));
        init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) -TOP_FOOT_SIZE);
      }
    }

    else {
      /* Try to merge with an existing segment */
      msegmentptr sp = &m->seg;
      /* Only consider most recent segment if traversal suppressed */
      while (sp != 0 && tbase != sp->base + sp->size)
        sp = (NO_SEGMENT_TRAVERSAL) ? 0 : sp->next;
      if (sp != 0 &&
          !is_extern_segment(sp) &&
          (sp->sflags & USE_MMAP_BIT) == mmap_flag &&
          segment_holds(sp, m->top)) { /* append */
        sp->size += tsize;
        init_top(m, m->top, m->topsize + tsize);
      }
      else {
        if (tbase < m->least_addr)
          m->least_addr = tbase;
        sp = &m->seg;
        while (sp != 0 && sp->base != tbase + tsize)
          sp = (NO_SEGMENT_TRAVERSAL) ? 0 : sp->next;
        if (sp != 0 &&
            !is_extern_segment(sp) &&
            (sp->sflags & USE_MMAP_BIT) == mmap_flag) {
          char* oldbase = sp->base;
          sp->base = tbase;
          sp->size += tsize;
          return prepend_alloc(m, tbase, oldbase, nb);
        }
        else
          add_segment(m, tbase, tsize, mmap_flag);
      }
    }

    if (nb < m->topsize) { /* Allocate from new or extended top space */
      size_t rsize = m->topsize -= nb;
      mchunkptr p = m->top;
      mchunkptr r = m->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(m, p, nb);
      check_top_chunk(m, m->top);
      check_malloced_chunk(m, chunk2mem(p), nb);
      return chunk2mem(p);
    }
  }

  MALLOC_FAILURE_ACTION;
  return 0;
}